

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O1

void anon_unknown.dwarf_17ff58::compressUncompressSubset(unsigned_short *raw,int n)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  ostream *poVar8;
  int iVar9;
  long lVar10;
  void *pvVar11;
  unsigned_short *puVar12;
  int iVar13;
  ulong uVar14;
  uint local_84;
  
  pvVar4 = operator_new__((ulong)(n * 3 + 0x40000));
  pvVar5 = operator_new__((ulong)(uint)n * 2);
  local_84 = n - 1;
  uVar2 = 0x10;
  if (n < 0x11) {
    uVar2 = local_84;
  }
  if (1 < (int)uVar2) {
    uVar6 = 1;
    pvVar11 = pvVar5;
    puVar12 = raw;
    do {
      puVar12 = puVar12 + 1;
      pvVar11 = (void *)((long)pvVar11 + 2);
      lVar10 = (long)n - uVar6;
      iVar9 = (int)lVar10;
      iVar3 = 0x11;
      if (0x11 < iVar9) {
        iVar3 = iVar9;
      }
      if ((long)(ulong)(iVar3 - 0x10) <= lVar10) {
        uVar14 = 0x11;
        if (0x11 < (int)local_84) {
          uVar14 = (ulong)local_84;
        }
        uVar14 = uVar14 - 0x10;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"compressing ",0xc);
          std::ostream::flush();
          iVar13 = (int)uVar14;
          iVar3 = Imf_3_4::hufCompress(raw + uVar6,iVar13,(char *)((long)pvVar4 + uVar6));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"uncompressing ",0xe);
          std::ostream::flush();
          Imf_3_4::hufUncompress
                    ((char *)((long)pvVar4 + uVar6),iVar3,(ushort *)((long)pvVar5 + uVar6 * 2),
                     iVar13);
          uVar7 = 0;
          do {
            if (*(unsigned_short *)((long)pvVar11 + uVar7 * 2) != puVar12[uVar7]) {
              __assert_fail("uncompressed[offset + i] == raw[offset + i]",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHuf.cpp"
                            ,0x8b,
                            "void (anonymous namespace)::compressUncompressSubset(const unsigned short *, int)"
                           );
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar14);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," bytes, compressed ",0x13);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," bytes ",7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(+",2);
          poVar8 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,",-",2);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar9 - iVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          bVar1 = (long)uVar14 < lVar10;
          uVar14 = uVar14 + 1;
        } while (bVar1);
      }
      uVar6 = uVar6 + 1;
      local_84 = local_84 - 1;
    } while (uVar6 != uVar2);
  }
  operator_delete__(pvVar5);
  operator_delete__(pvVar4);
  return;
}

Assistant:

void
compressUncompressSubset (const unsigned short raw[], int n)
{
    // Test various subsets of the data set

    Array<char>           compressed (3 * n + 4 * 65536);
    Array<unsigned short> uncompressed (n);

    int maxOffset = 16;
    if (n <= maxOffset) { maxOffset = n - 1; }

    for (int offset = 1; offset < maxOffset; ++offset)
    {

        int maxLength = n - offset;
        int minLength = maxLength - 16;
        if (minLength < 1) minLength = 1;

        for (int length = minLength; length <= maxLength; ++length)
        {
            cout << "compressing " << flush;

            int nCompressed =
                hufCompress (raw + offset, length, compressed + offset);

            cout << "uncompressing " << flush;

            hufUncompress (
                compressed + offset,
                nCompressed,
                uncompressed + offset,
                length);

            for (int i = 0; i < length; ++i)
                assert (uncompressed[offset + i] == raw[offset + i]);

            cout << sizeof (raw[0]) * length << " bytes, compressed "
                 << nCompressed << " bytes ";
            cout << "(+" << offset << ",-" << n - offset - length << ")"
                 << endl;
        }
    }
}